

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

int Cba_ObjAttrValue(Cba_Ntk_t *p,int i,int x)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  
  if (i < 0) {
    __assert_fail("i>=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                  ,0xf3,"int Cba_ObjAttrSize(Cba_Ntk_t *, int)");
  }
  if (0 < (p->vObjAttr).nSize) {
    p_00 = &p->vObjAttr;
    iVar1 = Vec_IntGetEntry(p_00,i);
    iVar3 = (p->vObjAttr).nSize;
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      if (iVar3 < 1) {
        uVar2 = 0;
      }
      else {
        uVar2 = Vec_IntGetEntry(p_00,i);
        if ((int)uVar2 < 0) goto LAB_003f0090;
      }
      if ((p->vAttrSto).nSize <= (int)uVar2) {
LAB_003f0090:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = (p->vAttrSto).pArray[uVar2];
      iVar3 = (p->vObjAttr).nSize;
    }
    if ((iVar3 < 1) || (iVar3 = Vec_IntGetEntry(p_00,i), iVar3 == 0)) {
      piVar4 = (int *)0x0;
    }
    else {
      if ((p->vObjAttr).nSize < 1) {
        uVar2 = 1;
      }
      else {
        iVar3 = Vec_IntGetEntry(p_00,i);
        if (iVar3 < -1) goto LAB_003f00af;
        uVar2 = iVar3 + 1;
      }
      if ((p->vAttrSto).nSize <= (int)uVar2) {
LAB_003f00af:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar4 = (p->vAttrSto).pArray + uVar2;
    }
    if (iVar1 < 1) {
      return 0;
    }
    uVar5 = 0;
    do {
      if (piVar4[uVar5] == x) {
        return *(int *)((long)piVar4 + ((uVar5 & 0xffffffff) << 2 | 4));
      }
      uVar5 = uVar5 + 2;
    } while ((int)uVar5 < iVar1);
  }
  return 0;
}

Assistant:

static inline int            Cba_ObjAttr( Cba_Ntk_t * p, int i )             { assert(i>=0); return Cba_NtkHasObjAttrs(p) ? Vec_IntGetEntry(&p->vObjAttr, i) : 0;          }